

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat_room.cpp
# Opt level: O2

PersonReference __thiscall ChatRoom::join(ChatRoom *this,string *name)

{
  pointer pcVar1;
  Person *this_00;
  element_type *peVar2;
  string *cr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pcVar4;
  PersonReference PVar5;
  allocator<char> local_a1;
  element_type *local_a0;
  string *local_90;
  string local_88;
  __shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (pointer)name->_M_string_length;
  local_a0 = (element_type *)this;
  local_90 = name;
  for (pcVar4 = (name->_M_dataplus)._M_p; pcVar4 != pcVar1; pcVar4 = pcVar4 + 0x10) {
    this_00 = *(Person **)pcVar4;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Room",&local_a1);
    std::operator+(&local_50,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pcVar4,
                   " has joined the chat...");
    Person::recieve(this_00,&local_88,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::make_shared<Person,std::__cxx11::string&>(&local_88);
  cr = local_90;
  std::vector<std::shared_ptr<Person>,std::allocator<std::shared_ptr<Person>>>::
  emplace_back<std::shared_ptr<Person>>
            ((vector<std::shared_ptr<Person>,std::allocator<std::shared_ptr<Person>>> *)local_90,
             (shared_ptr<Person> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  Person::set_hub(*(Person **)(cr->_M_string_length - 0x10),(ChatRoom *)cr);
  std::__shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             (__shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2> *)(cr->_M_string_length - 0x10));
  _Var3._M_pi = local_68._M_refcount._M_pi;
  peVar2 = local_a0;
  local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((_Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_> *)
   &(local_a0->m_name)._M_dataplus)->_M_impl).super__Vector_impl_data._M_start =
       (pointer)local_68._M_ptr;
  (local_a0->m_name)._M_string_length = (size_type)_Var3._M_pi;
  local_68._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  PVar5.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (PersonReference)PVar5.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ChatRoom::PersonReference ChatRoom::join(std::string name)
{
	for(auto& p : m_people)
	{
		p->recieve("Room", p->m_name + " has joined the chat...");
	}

	m_people.emplace_back(std::make_shared<Person>(name));
	m_people.back()->set_hub(*this);
	return m_people.back();
}